

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalNinjaGenerator::WriteNinjaRequiredVersion(cmLocalNinjaGenerator *this,ostream *os)

{
  cmGlobalGenerator *this_00;
  bool bVar1;
  ostream *poVar2;
  string requiredVersion;
  allocator<char> local_61;
  string local_60;
  string local_40 [32];
  
  cmGlobalNinjaGenerator::RequiredNinjaVersion_abi_cxx11_();
  bVar1 = cmGlobalNinjaGenerator::SupportsConsolePool
                    ((cmGlobalNinjaGenerator *)
                     (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator);
  if (bVar1) {
    cmGlobalNinjaGenerator::RequiredNinjaVersionForConsolePool_abi_cxx11_();
    std::__cxx11::string::operator=(local_40,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  bVar1 = cmGlobalNinjaGenerator::SupportsManifestRestat
                    ((cmGlobalNinjaGenerator *)
                     (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator);
  if (bVar1) {
    bVar1 = cmake::DoWriteGlobVerifyTarget
                      (((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)
                       ->CMakeInstance);
    if (bVar1) {
      this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"CMAKE_SUPPRESS_REGENERATION",&local_61);
      bVar1 = cmGlobalGenerator::GlobalSettingIsOn(this_00,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      if (!bVar1) {
        cmGlobalNinjaGenerator::RequiredNinjaVersionForManifestRestat_abi_cxx11_();
        std::__cxx11::string::operator=(local_40,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
      }
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"Minimal version of Ninja required by this file",&local_61);
  cmGlobalNinjaGenerator::WriteComment(os,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  poVar2 = std::operator<<(os,"ninja_required_version = ");
  poVar2 = std::operator<<(poVar2,local_40);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteNinjaRequiredVersion(std::ostream& os)
{
  // Default required version
  std::string requiredVersion = cmGlobalNinjaGenerator::RequiredNinjaVersion();

  // Ninja generator uses the 'console' pool if available (>= 1.5)
  if (this->GetGlobalNinjaGenerator()->SupportsConsolePool()) {
    requiredVersion =
      cmGlobalNinjaGenerator::RequiredNinjaVersionForConsolePool();
  }

  // The Ninja generator writes rules which require support for restat
  // when rebuilding build.ninja manifest (>= 1.8)
  if (this->GetGlobalNinjaGenerator()->SupportsManifestRestat() &&
      this->GetCMakeInstance()->DoWriteGlobVerifyTarget() &&
      !this->GetGlobalNinjaGenerator()->GlobalSettingIsOn(
        "CMAKE_SUPPRESS_REGENERATION")) {
    requiredVersion =
      cmGlobalNinjaGenerator::RequiredNinjaVersionForManifestRestat();
  }

  cmGlobalNinjaGenerator::WriteComment(
    os, "Minimal version of Ninja required by this file");
  os << "ninja_required_version = " << requiredVersion << std::endl
     << std::endl;
}